

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fCopyImageTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::anon_unknown_0::CopyImageTest::copyImageIter(CopyImageTest *this)

{
  ImageInfo *info;
  ostringstream *poVar1;
  ImageInfo *info_00;
  ostringstream *this_00;
  TestLog *pTVar2;
  State *pSVar3;
  ObjectWrapper *pOVar4;
  ObjectWrapper *pOVar5;
  pointer pAVar6;
  void *pvVar7;
  uint uVar8;
  uint uVar9;
  bool bVar10;
  pointer pCVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  deUint32 dVar15;
  int iVar16;
  undefined4 extraout_var;
  ulong uVar17;
  ulong uVar18;
  pointer vec;
  MessageBuilder *pMVar19;
  int z;
  int iVar20;
  int y;
  ulong uVar21;
  uint uVar22;
  int iVar23;
  uint uVar24;
  int iVar25;
  Vector<int,_3> local_318;
  pointer local_308;
  IVec3 dstBlockPixelSize;
  IVec3 srcBlockPixelSize;
  IVec3 srcPos;
  IVec3 dstCompleteBlockSize;
  int *local_2c8;
  IVec3 dstBlockPos;
  IVec3 maxCopyBlockSize;
  IVec3 srcBlockPos;
  IVec3 srcCompleteBlockSize;
  IVec3 srcCopySize;
  IVec3 dstCopySize;
  IVec3 dstSize;
  IVec3 srcSize;
  int local_228;
  int iStack_224;
  vector<deqp::gles31::Functional::(anonymous_namespace)::Copy,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Copy>_>
  copies;
  IVec3 dstPos;
  IVec3 srcTexelBlockPixelSize;
  
  pTVar2 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  iVar12 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  pSVar3 = this->m_state;
  pOVar4 = pSVar3->srcImage;
  pOVar5 = pSVar3->dstImage;
  copies.
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Copy,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Copy>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  copies.
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Copy,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Copy>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  copies.
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Copy,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Copy>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_308 = (pointer)CONCAT44(local_308._4_4_,(this->m_srcImageInfo).m_target);
  dVar15 = (this->m_dstImageInfo).m_target;
  getTexelBlockPixelSize((anon_unknown_0 *)&srcBlockPixelSize,(this->m_srcImageInfo).m_format);
  info_00 = &this->m_dstImageInfo;
  getTexelBlockPixelSize((anon_unknown_0 *)&dstBlockPixelSize,info_00->m_format);
  info = &this->m_srcImageInfo;
  bVar10 = (int)local_308 != 0x8d41;
  local_2c8 = &DAT_018d9398;
  uVar17 = 0;
  do {
    if ((ulong)(bVar10 || dVar15 != 0x8d41) * 2 + 1 == uVar17) {
      pCVar11 = copies.
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Copy,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Copy>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar18 = ((long)copies.
                      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Copy,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Copy>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)copies.
                     super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Copy,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Copy>_>
                     ._M_impl.super__Vector_impl_data._M_start) / 0x38;
      uVar21 = 0;
      uVar17 = uVar18 & 0xffffffff;
      if ((int)uVar18 < 1) {
        uVar17 = uVar21;
      }
      for (; this_00 = (ostringstream *)(srcTexelBlockPixelSize.m_data + 2), uVar21 != uVar17;
          uVar21 = uVar21 + 1) {
        srcTexelBlockPixelSize.m_data._0_8_ = pTVar2;
        std::__cxx11::ostringstream::ostringstream(this_00);
        std::operator<<((ostream *)this_00,"Copying area with size ");
        vec = pCVar11 + uVar21;
        tcu::operator<<((ostream *)this_00,&vec->size);
        std::operator<<((ostream *)this_00," from source image position ");
        tcu::operator<<((ostream *)this_00,&vec->srcPos);
        std::operator<<((ostream *)this_00," and mipmap level ");
        pMVar19 = tcu::MessageBuilder::operator<<
                            ((MessageBuilder *)&srcTexelBlockPixelSize,&vec->srcLevel);
        poVar1 = &pMVar19->m_str;
        std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                        " to destination image position ");
        tcu::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,&vec->dstPos);
        std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                        " and mipmap level ");
        pMVar19 = tcu::MessageBuilder::operator<<(pMVar19,&vec->dstLevel);
        poVar1 = &pMVar19->m_str;
        std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,". ");
        std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                        "Size in destination format is ");
        tcu::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,&vec->dstSize);
        tcu::MessageBuilder::operator<<(pMVar19,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(this_00);
        iVar13 = vec->dstLevel;
        iVar14 = vec->srcLevel;
        local_308 = *(pointer *)(CONCAT44(extraout_var,iVar12) + 0x310);
        (*(code *)local_308)
                  (pOVar4->m_object,(this->m_srcImageInfo).m_target,iVar14,(vec->srcPos).m_data[0],
                   (vec->srcPos).m_data[1],(vec->srcPos).m_data[2],pOVar5->m_object,
                   (this->m_dstImageInfo).m_target,(long)iVar13,(vec->dstPos).m_data[0],
                   (vec->dstPos).m_data[1],(vec->dstPos).m_data[2],(vec->size).m_data[0],
                   (vec->size).m_data[1],(vec->size).m_data[2]);
        dVar15 = (**(code **)(CONCAT44(extraout_var,iVar12) + 0x800))();
        glu::checkError(dVar15,"glCopyImageSubData failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fCopyImageTests.cpp"
                        ,0x460);
        pAVar6 = (pSVar3->srcImageLevels).
                 super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_308 = (pSVar3->dstImageLevels).
                    super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + iVar13;
        getTexelBlockPixelSize((anon_unknown_0 *)&srcTexelBlockPixelSize,info->m_format);
        iVar20 = getTexelBlockSize(info->m_format);
        tcu::operator/((tcu *)&srcBlockPixelSize,&vec->srcPos,&srcTexelBlockPixelSize);
        getTexelBlockStride((anon_unknown_0 *)&dstBlockPixelSize,info,iVar14);
        getTexelBlockPixelSize((anon_unknown_0 *)&srcSize,info_00->m_format);
        getTexelBlockSize(info_00->m_format);
        tcu::operator/((tcu *)&dstSize,&vec->dstPos,&srcSize);
        getTexelBlockStride((anon_unknown_0 *)&srcCompleteBlockSize,info_00,iVar13);
        tcu::operator/((tcu *)&dstCompleteBlockSize,&vec->size,&srcTexelBlockPixelSize);
        for (iVar13 = 0; iVar13 < dstCompleteBlockSize.m_data[2]; iVar13 = iVar13 + 1) {
          for (iVar23 = 0; iVar23 < dstCompleteBlockSize.m_data[1]; iVar23 = iVar23 + 1) {
            maxCopyBlockSize.m_data[0] = 0;
            maxCopyBlockSize.m_data[1] = iVar23;
            maxCopyBlockSize.m_data[2] = iVar13;
            tcu::operator+((tcu *)&srcBlockPos,&srcBlockPixelSize,&maxCopyBlockSize);
            tcu::operator*((tcu *)&local_318,(Vector<int,_3> *)&srcBlockPos,&dstBlockPixelSize);
            iVar25 = sumComponents(&local_318);
            pvVar7 = pAVar6[iVar14].m_ptr;
            tcu::operator+((tcu *)&srcBlockPos,&dstSize,&maxCopyBlockSize);
            tcu::operator*((tcu *)&local_318,(Vector<int,_3> *)&srcBlockPos,&srcCompleteBlockSize);
            iVar16 = sumComponents(&local_318);
            memcpy((void *)((long)iVar16 + (long)local_308->m_ptr),
                   (void *)((long)iVar25 + (long)pvVar7),
                   (long)(dstCompleteBlockSize.m_data[0] * iVar20));
          }
        }
      }
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::Copy,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Copy>_>
      ::~vector(&copies);
      return;
    }
    iVar14 = 0;
    iVar13 = 0;
    if ((int)local_308 == 0x8d41) {
LAB_0139b512:
      iVar14 = 0;
      if (dVar15 != 0x8d41) {
        if (1 < uVar17) goto LAB_0139b545;
        iVar14 = *local_2c8;
      }
    }
    else {
      if (uVar17 < 2) {
        iVar13 = *local_2c8;
        goto LAB_0139b512;
      }
      iVar13 = getLastFullLevel(info);
      if (dVar15 != 0x8d41) {
LAB_0139b545:
        iVar14 = getLastFullLevel(info_00);
      }
    }
    getLevelSize((anon_unknown_0 *)&srcSize,(this->m_srcImageInfo).m_target,
                 &(this->m_srcImageInfo).m_size,iVar13);
    getLevelSize((anon_unknown_0 *)&dstSize,(this->m_dstImageInfo).m_target,
                 &(this->m_dstImageInfo).m_size,iVar14);
    srcCompleteBlockSize.m_data[0] = srcSize.m_data[0] / srcBlockPixelSize.m_data[0];
    srcCompleteBlockSize.m_data[1] = srcSize.m_data[1] / srcBlockPixelSize.m_data[1];
    srcCompleteBlockSize.m_data[2] = 6;
    if ((int)local_308 != 0x8513) {
      srcCompleteBlockSize.m_data[2] = srcSize.m_data[2] / srcBlockPixelSize.m_data[2];
    }
    dstCompleteBlockSize.m_data[0] = dstSize.m_data[0] / dstBlockPixelSize.m_data[0];
    dstCompleteBlockSize.m_data[1] = dstSize.m_data[1] / dstBlockPixelSize.m_data[1];
    dstCompleteBlockSize.m_data[2] = 6;
    if (dVar15 != 0x8513) {
      dstCompleteBlockSize.m_data[2] = dstSize.m_data[2] / dstBlockPixelSize.m_data[2];
    }
    tcu::min<int,3>((tcu *)&maxCopyBlockSize,&srcCompleteBlockSize,&dstCompleteBlockSize);
    uVar8 = ((int)(((uint)(maxCopyBlockSize.m_data[0] >> 0x1f) >> 0x1e) + maxCopyBlockSize.m_data[0]
                  ) >> 2) * 2;
    uVar9 = ((int)(((uint)(maxCopyBlockSize.m_data[1] >> 0x1f) >> 0x1e) + maxCopyBlockSize.m_data[1]
                  ) >> 2) * 2;
    uVar22 = -(uint)(2 < (int)uVar8);
    uVar24 = -(uint)(2 < (int)uVar9);
    iVar20 = (maxCopyBlockSize.m_data[2] / 4) * 2;
    if (iVar20 < 3) {
      iVar20 = 2;
    }
    iVar23 = (~uVar22 & 2 | uVar8 & uVar22) - 1;
    iVar25 = (~uVar24 & 2 | uVar9 & uVar24) - 1;
    iVar20 = iVar20 + -1;
    local_318.m_data[1] = iVar25;
    local_318.m_data[0] = iVar23;
    local_318.m_data[2] = iVar20;
    tcu::operator-((tcu *)&srcBlockPos,&srcCompleteBlockSize,&local_318);
    dstBlockPos.m_data[0] = 0;
    dstBlockPos.m_data[1] = 0;
    dstBlockPos.m_data[2] = 0;
    tcu::operator*((tcu *)&srcPos,&srcBlockPos,&srcBlockPixelSize);
    tcu::operator*((tcu *)&dstPos,&dstBlockPos,&dstBlockPixelSize);
    tcu::operator*((tcu *)&srcCopySize,&local_318,&srcBlockPixelSize);
    tcu::operator*((tcu *)&dstCopySize,&local_318,&dstBlockPixelSize);
    Copy::Copy((Copy *)&srcTexelBlockPixelSize,&srcPos,iVar13,&dstPos,iVar14,&srcCopySize,
               &dstCopySize);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::Copy,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Copy>_>
    ::push_back(&copies,(Copy *)&srcTexelBlockPixelSize);
    srcBlockPos.m_data[0] = 0;
    srcBlockPos.m_data[1] = 0;
    srcBlockPos.m_data[2] = 0;
    local_318.m_data[2] = iVar20;
    tcu::operator-((tcu *)&dstBlockPos,&dstCompleteBlockSize,&local_318);
    tcu::operator*((tcu *)&srcPos,&srcBlockPos,&srcBlockPixelSize);
    tcu::operator*((tcu *)&dstPos,&dstBlockPos,&dstBlockPixelSize);
    tcu::operator*((tcu *)&srcCopySize,&local_318,&srcBlockPixelSize);
    tcu::operator*((tcu *)&dstCopySize,&local_318,&dstBlockPixelSize);
    Copy::Copy((Copy *)&srcTexelBlockPixelSize,&srcPos,iVar13,&dstPos,iVar14,&srcCopySize,
               &dstCopySize);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::Copy,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Copy>_>
    ::push_back(&copies,(Copy *)&srcTexelBlockPixelSize);
    local_318.m_data[2] = iVar20;
    tcu::operator/((tcu *)&srcPos,&srcCompleteBlockSize,4);
    tcu::operator*((tcu *)&dstBlockPos,4,&srcPos);
    tcu::operator-((tcu *)&srcTexelBlockPixelSize,&dstBlockPos,&local_318);
    tcu::Vector<int,_3>::Vector((Vector<int,_3> *)&dstPos,0);
    tcu::max<int,3>((tcu *)&srcBlockPos,(Vector<int,_3> *)&srcTexelBlockPixelSize,
                    (Vector<int,_3> *)&dstPos);
    tcu::operator/((tcu *)&dstPos,&dstCompleteBlockSize,4);
    tcu::operator*((tcu *)&srcPos,4,(Vector<int,_3> *)&dstPos);
    tcu::operator-((tcu *)&srcTexelBlockPixelSize,&srcPos,&local_318);
    tcu::Vector<int,_3>::Vector(&srcCopySize,0);
    tcu::max<int,3>((tcu *)&dstBlockPos,(Vector<int,_3> *)&srcTexelBlockPixelSize,&srcCopySize);
    tcu::operator*((tcu *)&srcPos,&srcBlockPos,&srcBlockPixelSize);
    tcu::operator*((tcu *)&dstPos,&dstBlockPos,&dstBlockPixelSize);
    tcu::operator*((tcu *)&srcCopySize,&local_318,&srcBlockPixelSize);
    tcu::operator*((tcu *)&dstCopySize,&local_318,&dstBlockPixelSize);
    Copy::Copy((Copy *)&srcTexelBlockPixelSize,&srcPos,iVar13,&dstPos,iVar14,&srcCopySize,
               &dstCopySize);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::Copy,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Copy>_>
    ::push_back(&copies,(Copy *)&srcTexelBlockPixelSize);
    uVar17 = uVar17 + 1;
    local_2c8 = local_2c8 + 1;
  } while( true );
}

Assistant:

void CopyImageTest::copyImageIter (void)
{
	TestLog&						log				= m_testCtx.getLog();
	const glw::Functions&			gl				= m_context.getRenderContext().getFunctions();
	glu::ObjectWrapper&				srcImage		= *m_state->srcImage;
	glu::ObjectWrapper&				dstImage		= *m_state->dstImage;

	vector<ArrayBuffer<deUint8> >&	srcImageLevels	= m_state->srcImageLevels;
	vector<ArrayBuffer<deUint8> >&	dstImageLevels	= m_state->dstImageLevels;
	vector<Copy>					copies;

	generateCopies(copies, m_srcImageInfo, m_dstImageInfo);

	for (int copyNdx = 0; copyNdx < (int)copies.size(); copyNdx++)
	{
		const Copy& copy = copies[copyNdx];

		log	<< TestLog::Message
			<< "Copying area with size " << copy.size
			<< " from source image position " << copy.srcPos << " and mipmap level " << copy.srcLevel
			<< " to destination image position " << copy.dstPos << " and mipmap level " << copy.dstLevel << ". "
			<< "Size in destination format is " << copy.dstSize
			<< TestLog::EndMessage;

		copyImage(gl, *dstImage, dstImageLevels, m_dstImageInfo, copy.dstLevel, copy.dstPos,
					  *srcImage, srcImageLevels, m_srcImageInfo, copy.srcLevel, copy.srcPos, copy.size);
	}
}